

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O0

CURLcode http_proxy_cf_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  long *plVar1;
  _Bool _Var2;
  CURLcode CVar3;
  uint local_50;
  Curl_cfilter *pCStack_48;
  int alpn;
  Curl_cfilter *cf_protocol;
  CURLcode result;
  cf_proxy_ctx *ctx;
  _Bool *done_local;
  _Bool blocking_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  plVar1 = (long *)cf->ctx;
  if ((cf->field_0x24 & 1) == 0) {
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
        (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"connect");
    }
    while( true ) {
      CVar3 = (*cf->next->cft->do_connect)(cf->next,data,blocking,done);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      if ((*done & 1U) == 0) {
        return CURLE_OK;
      }
      *done = false;
      if (*plVar1 != 0) break;
      _Var2 = Curl_conn_cf_is_ssl(cf->next);
      if (_Var2) {
        local_50 = (uint)cf->conn->proxy_alpn;
      }
      else {
        local_50 = 2;
      }
      if (2 < local_50) {
        if (local_50 == 3) {
          if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)
              ) && ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
            Curl_trc_cf_infof(data,cf,"installing subfilter for HTTP/2");
          }
          if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0))
          {
            Curl_infof(data,"CONNECT tunnel: HTTP/2 negotiated");
          }
          cf_protocol._4_4_ = Curl_cf_h2_proxy_insert_after(cf,data);
          if (cf_protocol._4_4_ == CURLE_OK) {
            pCStack_48 = cf->next;
            goto LAB_00b1692a;
          }
        }
        else {
          if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0))
          {
            Curl_infof(data,"CONNECT tunnel: unsupported ALPN(%d) negotiated",(ulong)local_50);
          }
          cf_protocol._4_4_ = CURLE_COULDNT_CONNECT;
        }
        goto LAB_00b16947;
      }
      if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0))
          && (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"installing subfilter for HTTP/1.1");
      }
      if ((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) {
        Curl_infof(data,"CONNECT tunnel: HTTP/1.%d negotiated",(ulong)(local_50 != 1));
      }
      cf_protocol._4_4_ = Curl_cf_h1_proxy_insert_after(cf,data);
      if (cf_protocol._4_4_ != CURLE_OK) goto LAB_00b16947;
      pCStack_48 = cf->next;
LAB_00b1692a:
      *plVar1 = (long)pCStack_48;
    }
    cf_protocol._4_4_ = CURLE_OK;
LAB_00b16947:
    if (cf_protocol._4_4_ == CURLE_OK) {
      cf->field_0x24 = cf->field_0x24 & 0xfe | 1;
      *done = true;
    }
    cf_local._4_4_ = cf_protocol._4_4_;
  }
  else {
    *done = true;
    cf_local._4_4_ = CURLE_OK;
  }
  return cf_local._4_4_;
}

Assistant:

static CURLcode http_proxy_cf_connect(struct Curl_cfilter *cf,
                                      struct Curl_easy *data,
                                      bool blocking, bool *done)
{
  struct cf_proxy_ctx *ctx = cf->ctx;
  CURLcode result;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  CURL_TRC_CF(data, cf, "connect");
connect_sub:
  result = cf->next->cft->do_connect(cf->next, data, blocking, done);
  if(result || !*done)
    return result;

  *done = FALSE;
  if(!ctx->cf_protocol) {
    struct Curl_cfilter *cf_protocol = NULL;
    int alpn = Curl_conn_cf_is_ssl(cf->next)?
      cf->conn->proxy_alpn : CURL_HTTP_VERSION_1_1;

    /* First time call after the subchain connected */
    switch(alpn) {
    case CURL_HTTP_VERSION_NONE:
    case CURL_HTTP_VERSION_1_0:
    case CURL_HTTP_VERSION_1_1:
      CURL_TRC_CF(data, cf, "installing subfilter for HTTP/1.1");
      infof(data, "CONNECT tunnel: HTTP/1.%d negotiated",
            (alpn == CURL_HTTP_VERSION_1_0)? 0 : 1);
      result = Curl_cf_h1_proxy_insert_after(cf, data);
      if(result)
        goto out;
      cf_protocol = cf->next;
      break;
#ifdef USE_NGHTTP2
    case CURL_HTTP_VERSION_2:
      CURL_TRC_CF(data, cf, "installing subfilter for HTTP/2");
      infof(data, "CONNECT tunnel: HTTP/2 negotiated");
      result = Curl_cf_h2_proxy_insert_after(cf, data);
      if(result)
        goto out;
      cf_protocol = cf->next;
      break;
#endif
    default:
      infof(data, "CONNECT tunnel: unsupported ALPN(%d) negotiated", alpn);
      result = CURLE_COULDNT_CONNECT;
      goto out;
    }

    ctx->cf_protocol = cf_protocol;
    /* after we installed the filter "below" us, we call connect
     * on out sub-chain again.
     */
    goto connect_sub;
  }
  else {
    /* subchain connected and we had already installed the protocol filter.
     * This means the protocol tunnel is established, we are done.
     */
    DEBUGASSERT(ctx->cf_protocol);
    result = CURLE_OK;
  }

out:
  if(!result) {
    cf->connected = TRUE;
    *done = TRUE;
  }
  return result;
}